

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-option-parser.cc
# Opt level: O0

void __thiscall
OptionParser_StopProccessing_Test::~OptionParser_StopProccessing_Test
          (OptionParser_StopProccessing_Test *this)

{
  OptionParser_StopProccessing_Test *this_local;
  
  ~OptionParser_StopProccessing_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(OptionParser, StopProccessing) {
  std::string argument;
  bool has_x = false;
  OptionParser parser("prog", "desc");
  parser.AddArgument("arg", OptionParser::ArgumentCount::ZeroOrMore,
                     [&](const char* arg) { argument += arg; });
  parser.AddOption('x', "x", "help", [&]() { has_x = true; });

  const char* args_many[] = {"prog name", "-x", "--", "foo", "-x", "-y", "bar"};
  parser.Parse(7, const_cast<char**>(args_many));
  EXPECT_TRUE(has_x);
  EXPECT_EQ("foo-x-ybar", argument);
}